

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

int Mf_SetAddCut(Mf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Mf_Cut_t *pMVar1;
  Mf_Cut_t *pMVar2;
  int iVar3;
  Mf_Cut_t *t;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  int nSizeC;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  if (nCuts == 0) {
    return 1;
  }
  if (0 < nCuts) {
    uVar5 = (ulong)(uint)nCuts;
    bVar6 = true;
    uVar4 = 0;
LAB_006e70b3:
    pMVar1 = pCuts[uVar5];
    uVar8 = *(uint *)&pMVar1->field_0x10 >> 0x1b;
    do {
      pMVar2 = pCuts[uVar4];
      uVar10 = *(uint *)&pMVar2->field_0x10 >> 0x1b;
      if ((uVar8 < uVar10) && ((pMVar1->Sign & ~pMVar2->Sign) == 0)) {
        if (*(uint *)&pMVar1->field_0x10 < 0x8000000) goto LAB_006e711a;
        uVar11 = 0;
        uVar9 = 0;
        do {
          if (pMVar1->pLeaves[(int)uVar9] < pMVar2->pLeaves[uVar11]) break;
          if ((pMVar2->pLeaves[uVar11] == pMVar1->pLeaves[(int)uVar9]) &&
             (uVar9 = uVar9 + 1, uVar9 == uVar8)) goto LAB_006e711a;
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
      uVar4 = uVar4 + 1;
      if (uVar4 == uVar5) {
        if (!bVar6) goto LAB_006e7140;
        goto LAB_006e7176;
      }
    } while( true );
  }
  goto LAB_006e71d2;
LAB_006e711a:
  *(uint *)&pMVar2->field_0x10 = *(uint *)&pMVar2->field_0x10 | 0xf8000000;
  uVar4 = uVar4 + 1;
  bVar6 = false;
  if (uVar4 == uVar5) goto LAB_006e7140;
  goto LAB_006e70b3;
LAB_006e7140:
  uVar5 = 0;
  iVar3 = 0;
  do {
    if (*(uint *)&pCuts[uVar5]->field_0x10 < 0xf8000000) {
      lVar7 = (long)iVar3;
      if (lVar7 < (long)uVar5) {
        pMVar1 = pCuts[lVar7];
        pCuts[lVar7] = pCuts[uVar5];
        pCuts[uVar5] = pMVar1;
      }
      iVar3 = iVar3 + 1;
    }
    uVar5 = uVar5 + 1;
  } while (nCuts + 1 != uVar5);
  nCuts = iVar3 - 1;
LAB_006e7176:
  if (0 < nCuts) {
    lVar7 = (ulong)(uint)nCuts + 1;
    while( true ) {
      pMVar1 = pCuts[lVar7 + -2];
      pMVar2 = pCuts[lVar7 + -1];
      if (pMVar1->Flow < pMVar2->Flow) break;
      if (pMVar1->Flow <= pMVar2->Flow) {
        if ((pMVar1->Delay < pMVar2->Delay) ||
           ((pMVar1->Delay <= pMVar2->Delay &&
            (*(uint *)&pMVar1->field_0x10 >> 0x1b < *(uint *)&pMVar2->field_0x10 >> 0x1b)))) break;
      }
      pCuts[lVar7 + -2] = pMVar2;
      pCuts[lVar7 + -1] = pMVar1;
      lVar7 = lVar7 + -1;
      if (lVar7 < 2) break;
    }
  }
LAB_006e71d2:
  iVar3 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar3 = nCuts + 1U;
  }
  return iVar3;
}

Assistant:

static inline int Mf_SetAddCut( Mf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Mf_SetLastCutContainsArea(pCuts, nCuts);
    Mf_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}